

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

bool __thiscall cmCTestCVS::WriteXMLUpdates(cmCTestCVS *this,cmXMLWriter *xml)

{
  cmCTest *pcVar1;
  _Base_ptr p_Var2;
  char *local_1b8 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,
                  "   Gathering version information (one . per updated file):\n    ");
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0x110,local_1b8[0],false);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  for (p_Var2 = (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Dirs)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    WriteXMLDirectory(this,xml,(string *)(p_Var2 + 1),(Directory *)(p_Var2 + 2));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0x116,local_1b8[0],false);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  return true;
}

Assistant:

bool cmCTestCVS::WriteXMLUpdates(cmXMLWriter& xml)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per updated file):\n"
             "    "
               << std::flush);

  for (auto const& d : this->Dirs) {
    this->WriteXMLDirectory(xml, d.first, d.second);
  }

  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);

  return true;
}